

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<TPZGraphEl_*> * __thiscall
TPZVec<TPZGraphEl_*>::operator=(TPZVec<TPZGraphEl_*> *this,initializer_list<TPZGraphEl_*> *list)

{
  iterator ppTVar1;
  size_type sVar2;
  TPZGraphEl **ppTVar3;
  long lVar4;
  
  (*this->_vptr_TPZVec[3])();
  ppTVar1 = list->_M_array;
  sVar2 = list->_M_len;
  ppTVar3 = this->fStore;
  for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)ppTVar3 + lVar4) = *(undefined8 *)((long)ppTVar1 + lVar4);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}